

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall
perfetto::TracingServiceImpl::OnDisableTracingTimeout
          (TracingServiceImpl *this,TracingSessionID tsid)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  _Base_ptr p_Var6;
  
  if ((tsid != 0) &&
     (p_Var2 = (this->tracing_sessions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
     p_Var2 != (_Base_ptr)0x0)) {
    p_Var1 = &(this->tracing_sessions_)._M_t._M_impl.super__Rb_tree_header;
    p_Var6 = &p_Var1->_M_header;
    do {
      if (*(ulong *)(p_Var2 + 1) >= tsid) {
        p_Var6 = p_Var2;
      }
      p_Var2 = (&p_Var2->_M_left)[*(ulong *)(p_Var2 + 1) < tsid];
    } while (p_Var2 != (_Base_ptr)0x0);
    if ((((_Rb_tree_header *)p_Var6 != p_Var1) && (*(ulong *)(p_Var6 + 1) <= tsid)) &&
       (*(int *)&p_Var6[0x18]._M_parent == 3)) {
      pcVar3 = "/";
      do {
        pcVar5 = pcVar3 + 2;
        pcVar3 = pcVar3 + 1;
      } while (*pcVar5 != '\0');
      pcVar5 = "";
      do {
        pcVar4 = pcVar5 + 1;
        pcVar5 = pcVar5 + 1;
      } while (*pcVar4 != '\0');
      do {
        pcVar4 = pcVar3;
        if (pcVar4 + 1 <
            "workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
           ) break;
        pcVar3 = pcVar4 + -1;
      } while ((pcVar5 <= pcVar4) || (*pcVar4 != '/'));
      base::LogMessage(kLogImportant,pcVar4 + 1,0xe11f,
                       "Timeout while waiting for ACKs for tracing session %lu");
      DisableTracingNotifyConsumerAndFlushFile(this,(TracingSession *)&p_Var6[1]._M_parent);
      return;
    }
  }
  return;
}

Assistant:

TracingServiceImpl::TracingSession* TracingServiceImpl::GetTracingSession(
    TracingSessionID tsid) {
  PERFETTO_DCHECK_THREAD(thread_checker_);
  auto it = tsid ? tracing_sessions_.find(tsid) : tracing_sessions_.end();
  if (it == tracing_sessions_.end())
    return nullptr;
  return &it->second;
}